

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O0

void __thiscall
Tjen::Node::Transition::Transition
          (Transition *this,Node *from,Node *to,char *oldStack,string *newStack,char input)

{
  char input_local;
  string *newStack_local;
  char *oldStack_local;
  Node *to_local;
  Node *from_local;
  Transition *this_local;
  
  std::__cxx11::string::string((string *)&this->newstack);
  this->from = from;
  std::__cxx11::string::operator=((string *)&this->newstack,(string *)newStack);
  this->oldStack = *oldStack;
  this->to = to;
  this->input = input;
  return;
}

Assistant:

Tjen::Node::Transition::Transition(Node* from, Node* to, char &oldStack, std::string &newStack, const char input) {
    this->from = from;
    this->newstack = newStack;
    this->oldStack = oldStack;
    this->to = to;
    this->input = input;
}